

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O0

Remotes * __thiscall
Omega_h::Dist::exch(Remotes *__return_storage_ptr__,Dist *this,Remotes *data,Int width)

{
  Read<int> local_98;
  Read<int> local_88;
  Read<int> local_78;
  undefined1 local_68 [8];
  Read<int> idxs;
  Read<int> ranks;
  Int width_local;
  Remotes *data_local;
  Dist *this_local;
  
  ranks.write_.shared_alloc_.direct_ptr._4_4_ = width;
  Read<int>::Read((Read<int> *)&stack0xffffffffffffffb8,&data->ranks);
  exch<int>((Dist *)&stack0xffffffffffffffc8,(Read<int> *)this,
            (Int)(Read<int> *)&stack0xffffffffffffffb8);
  Read<int>::~Read((Read<int> *)&stack0xffffffffffffffb8);
  Read<int>::Read(&local_78,&data->idxs);
  exch<int>((Dist *)local_68,(Read<int> *)this,(Int)&local_78);
  Read<int>::~Read(&local_78);
  Read<int>::Read(&local_88,(Read<int> *)&stack0xffffffffffffffc8);
  Read<int>::Read(&local_98,(Read<int> *)local_68);
  Remotes::Remotes(__return_storage_ptr__,&local_88,&local_98);
  Read<int>::~Read(&local_98);
  Read<int>::~Read(&local_88);
  Read<int>::~Read((Read<int> *)local_68);
  Read<int>::~Read((Read<int> *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

Remotes Dist::exch(Remotes data, Int width) const {
  auto ranks = exch(data.ranks, width);
  auto idxs = exch(data.idxs, width);
  return Remotes(ranks, idxs);
}